

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

size_t fio_flush_all(void)

{
  ssize_t sVar1;
  ulong local_20;
  uintptr_t i;
  size_t count;
  
  if (fio_data == (fio_data_s *)0x0) {
    count = 0;
  }
  else {
    i = 0;
    for (local_20 = 0; local_20 <= fio_data->max_protocol_fd; local_20 = local_20 + 1) {
      if ((*(char *)((long)fio_data + local_20 * 0xa8 + 0x6f) != '\0') ||
         (*(long *)((long)fio_data + local_20 * 0xa8 + 0x40) != 0)) {
        sVar1 = fio_flush(local_20 << 8 | (ulong)*(byte *)((long)fio_data + local_20 * 0xa8 + 0x6d))
        ;
        if (0 < sVar1) {
          i = i + 1;
        }
      }
    }
    count = i;
  }
  return count;
}

Assistant:

size_t fio_flush_all(void) {
  if (!fio_data)
    return 0;
  size_t count = 0;
  for (uintptr_t i = 0; i <= fio_data->max_protocol_fd; ++i) {
    if ((fd_data(i).open || fd_data(i).packet) && fio_flush(fd2uuid(i)) > 0)
      ++count;
  }
  return count;
}